

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O0

ssize_t __thiscall
OpenMesh::IO::_OMReader_::read(_OMReader_ *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  mostream *pmVar5;
  ostream *this_00;
  undefined7 extraout_var;
  Options *pOVar6;
  undefined7 uVar7;
  undefined4 in_register_00000034;
  bool result;
  Options *_opt_local;
  BaseImporter *_bi_local;
  istream *_is_local;
  _OMReader_ *this_local;
  
  lVar3 = (**(code **)(*__buf + 200))();
  if (lVar3 == 0) {
    this_local._7_1_ = false;
    uVar7 = 0;
  }
  else {
    Options::operator+=((Options *)__nbytes,1);
    Options::operator=(&this->fileOptions_,1);
    uVar4 = std::ios::good();
    if ((uVar4 & 1) == 0) {
      pmVar5 = omerr();
      this_00 = std::operator<<(&pmVar5->super_ostream,"[OMReader] : cannot read from stream ");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
      uVar7 = extraout_var;
    }
    else {
      this_local._7_1_ =
           read_binary(this,(istream *)CONCAT44(in_register_00000034,__fd),(BaseImporter *)__buf,
                       (Options *)__nbytes);
      if (this_local._7_1_) {
        Options::operator+=((Options *)__nbytes,1);
      }
      uVar1 = Options::operator_cast_to_int((Options *)__nbytes);
      uVar2 = Options::operator_cast_to_int(&this->fileOptions_);
      pOVar6 = Options::operator=((Options *)__nbytes,uVar1 & uVar2);
      uVar7 = (undefined7)((ulong)pOVar6 >> 8);
    }
  }
  return CONCAT71(uVar7,this_local._7_1_);
}

Assistant:

bool _OMReader_::read(std::istream& _is, BaseImporter& _bi, Options& _opt)
{
  // check whether importer can give us an OpenMesh BaseKernel
  if (!_bi.kernel())
    return false;

  _opt += Options::Binary; // only binary format supported!
  fileOptions_ = Options::Binary;

  if (!_is.good()) {
    omerr() << "[OMReader] : cannot read from stream " << std::endl;
    return false;
  }

  // Pass stream to read method, remember result
  bool result = read_binary(_is, _bi, _opt);

  if (result)
    _opt += Options::Binary;

  _opt = _opt & fileOptions_;

  return result;
}